

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void __thiscall
module_level_html_actions::module2(module_level_html_actions *this,string *module,int level)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  bVar3 = level - 2U < 0x3ffffffd;
  iVar2 = this->level_ + -1;
  if (iVar2 <= level && bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<strong>",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  if (level < 0x3fffffff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<sup>",5);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,level);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</sup>",6);
  }
  if (iVar2 <= level && bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"</strong>",9);
    return;
  }
  return;
}

Assistant:

void module2( std::string const & module, int level )
    {
        std::cout << " ";

        bool important = level < unknown_level && level > 1 && level >= level_ - 1;

        if( important )
        {
            std::cout << "<strong>";
        }

        std::cout << module;

        if( level < unknown_level )
        {
            std::cout << "<sup>" << level << "</sup>";
        }

        if( important )
        {
            std::cout << "</strong>";
        }
    }